

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_group_base.hpp
# Opt level: O2

void __thiscall oqpi::task_group_base::~task_group_base(task_group_base *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~task_group_base() = default;